

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerAnalysisFSInv.h
# Opt level: O0

void dg::pta::PointerAnalysisFSInv::replaceLocalsWithInv(PSNode *where,PointsToSetT *S1)

{
  bool bVar1;
  PSNodeAlloc *alloc;
  Pointer *ptr;
  const_iterator __end2;
  const_iterator __begin2;
  PointsToSetT *__range2;
  PointsToSetT S;
  PointerIdPointsToSet *in_stack_ffffffffffffff48;
  PSNode *in_stack_ffffffffffffff50;
  PointerIdPointsToSet *this;
  Offset in_stack_ffffffffffffff58;
  PSNodeAlloc *in_stack_ffffffffffffff60;
  Pointer in_stack_ffffffffffffff68;
  Pointer *this_00;
  
  PointerIdPointsToSet::PointerIdPointsToSet((PointerIdPointsToSet *)0x1a3011);
  PointerIdPointsToSet::begin((PointerIdPointsToSet *)in_stack_ffffffffffffff50);
  PointerIdPointsToSet::end((PointerIdPointsToSet *)in_stack_ffffffffffffff50);
  while (bVar1 = PointerIdPointsToSet::const_iterator::operator!=
                           ((const_iterator *)in_stack_ffffffffffffff50,
                            (const_iterator *)in_stack_ffffffffffffff48), bVar1) {
    in_stack_ffffffffffffff68 =
         PointerIdPointsToSet::const_iterator::operator*
                   ((const_iterator *)in_stack_ffffffffffffff48);
    this_00 = (Pointer *)&stack0xffffffffffffff68;
    bVar1 = Pointer::isNull(this_00);
    if ((((!bVar1) && (bVar1 = Pointer::isUnknown(this_00), !bVar1)) &&
        (bVar1 = Pointer::isInvalidated(this_00), !bVar1)) &&
       ((in_stack_ffffffffffffff60 = PSNodeAlloc::get<dg::pta::PSNode>(in_stack_ffffffffffffff50),
        in_stack_ffffffffffffff60 != (PSNodeAlloc *)0x0 &&
        ((bVar1 = isLocal(in_stack_ffffffffffffff60,(PSNode *)in_stack_ffffffffffffff58.offset),
         !bVar1 || (bVar1 = knownInstance((PSNode *)0x1a30dc), !bVar1)))))) {
      PointerIdPointsToSet::add
                ((PointerIdPointsToSet *)this_00,
                 (Pointer *)in_stack_ffffffffffffff68.offset.offset.offset);
    }
    PointerIdPointsToSet::const_iterator::operator++((const_iterator *)in_stack_ffffffffffffff60);
  }
  this = INVALIDATED;
  Offset::Offset((Offset *)&stack0xffffffffffffff58,0);
  PointerIdPointsToSet::add
            ((PointerIdPointsToSet *)in_stack_ffffffffffffff68.target,
             (PSNode *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff68.offset.offset);
  PointerIdPointsToSet::swap(this,in_stack_ffffffffffffff48);
  PointerIdPointsToSet::~PointerIdPointsToSet((PointerIdPointsToSet *)0x1a314f);
  return;
}

Assistant:

static void replaceLocalsWithInv(PSNode *where, PointsToSetT &S1) {
        PointsToSetT S;

        for (const auto &ptr : S1) {
            if (ptr.isNull() || ptr.isUnknown() || ptr.isInvalidated())
                continue;

            if (PSNodeAlloc *alloc = PSNodeAlloc::get(ptr.target)) {
                // if this is not local pointer or it is,
                // but we do not know which instance is being destroyed,
                // then keep the pointer
                if (!isLocal(alloc, where) || !knownInstance(alloc))
                    S.add(ptr);
            }
        }

        S.add(INVALIDATED, 0);
        S1.swap(S);
    }